

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InlinePass::GenInlineCode
          (InlinePass *this,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *new_vars,iterator *call_inst_itr,
          UptrVectorIterator<spvtools::opt::BasicBlock,_false> call_block_itr)

{
  _Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  _Var1;
  Function *calleeFn;
  __uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
  _Var2;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_00;
  IRContext *this_01;
  BasicBlock *pBVar3;
  pointer pIVar4;
  _Hash_node_base *p_Var5;
  mapped_type pBVar6;
  DebugScope DVar7;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  __node_base this_02;
  bool bVar11;
  uint32_t uVar12;
  int iVar13;
  uint32_t uVar14;
  uint32_t resultId;
  mapped_type *ppFVar15;
  mapped_type *pmVar16;
  Instruction *pIVar17;
  Type *pTVar18;
  undefined4 extraout_var;
  mapped_type *ppBVar19;
  undefined8 extraout_RAX;
  uint uVar20;
  InlinePass *pIVar21;
  DebugInlinedAtContext *inlined_at_ctx_00;
  Instruction *line_inst;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *blk;
  _Hash_node_base *p_Var22;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> call_block_itr_00;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> callee_first_block;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> new_blk_ptr
  ;
  uint32_t entry_blk_label_id;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  single_trip_loop_cont_blk;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  callee2caller;
  DebugInlinedAtContext inlined_at_ctx;
  unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  preCallSB;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  postCallSB;
  DebugScope local_1b8;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *local_1b0;
  UnderlyingIterator local_1a8;
  uint32_t local_19c;
  undefined1 local_198 [16];
  code *local_188;
  _Manager_type p_Stack_180;
  undefined1 local_170 [8];
  undefined1 local_168 [8];
  DebugScope local_160;
  Instruction *local_158;
  __node_base local_150;
  __node_base local_148;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  *local_140;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_138;
  iterator local_100;
  iterator local_f8;
  iterator local_f0;
  undefined1 local_e8 [24];
  _Base_ptr local_d0;
  __node_base local_c8;
  _func_int **pp_Stack_c0;
  float local_b8;
  Instruction *local_b0;
  undefined1 auStack_a8 [16];
  pointer local_98;
  pointer local_90;
  pointer pIStack_88;
  uint32_t local_80;
  pointer local_78;
  undefined1 auStack_70 [8];
  undefined1 local_68 [56];
  
  local_138._M_buckets = &local_138._M_single_bucket;
  local_138._M_bucket_count = 1;
  local_138._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_138._M_element_count = 0;
  local_138._M_rehash_policy._M_max_load_factor = 1.0;
  local_138._M_rehash_policy._M_next_resize = 0;
  local_138._M_single_bucket = (__node_base_ptr)0x0;
  auStack_a8._8_8_ = auStack_70;
  local_98 = (pointer)0x1;
  local_90 = (pointer)0x0;
  pIStack_88 = (pointer)0x0;
  local_80 = 0x3f800000;
  local_78 = (pointer)0x0;
  auStack_70 = (undefined1  [8])0x0;
  local_68._0_8_ = local_68 + 0x30;
  local_68._8_8_ = (pointer)0x1;
  local_68._16_4_ = 0;
  local_68._20_4_ = 0;
  local_68._24_8_ = (pointer)0x0;
  local_68._32_4_ = 1.0;
  local_68._40_8_ = (pointer)0x0;
  local_68._48_8_ =
       (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        )0x0;
  pIVar17 = (call_inst_itr->super_iterator).node_;
  _Var1.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)
       (pIVar17->dbg_line_insts_).
       super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1b0 = (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               *)0x0;
  local_e8._0_8_ =
       (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)
       (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        )0x0;
  if (_Var1.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
      (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)
      (pIVar17->dbg_line_insts_).
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_e8._0_8_ = _Var1.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  }
  local_e8._16_8_ = auStack_a8;
  local_e8._8_8_ = pIVar17->dbg_scope_;
  local_d0 = (_Base_ptr)0x1;
  local_c8._M_nxt = (_Hash_node_base *)0x0;
  pp_Stack_c0 = (_func_int **)0x0;
  local_b8 = 1.0;
  local_b0 = (Instruction *)0x0;
  auStack_a8._0_8_ = (pointer)0x0;
  local_150._M_nxt = (_Hash_node_base *)new_blocks;
  IRContext::InvalidateAnalyses((this->super_Pass).context_,kAnalysisBegin);
  local_1a8._M_current = call_block_itr.iterator_._M_current._M_current;
  local_158 = BasicBlock::GetLoopMergeInst
                        (((call_block_itr.iterator_._M_current._M_current)->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
  local_148._M_nxt = (_Hash_node_base *)0x0;
  pIVar21 = (InlinePass *)&this->id2function_;
  local_198._0_4_ = Instruction::GetSingleWordOperand((call_inst_itr->super_iterator).node_,2);
  ppFVar15 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)pIVar21,(key_type *)local_198);
  calleeFn = *ppFVar15;
  local_f0.node_ = (call_inst_itr->super_iterator).node_;
  MapParams(pIVar21,calleeFn,(iterator *)&local_f0,
            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             *)&local_138);
  inlined_at_ctx_00 = (DebugInlinedAtContext *)local_e8;
  local_140 = new_vars;
  bVar11 = CloneAndMapLocals(this,calleeFn,new_vars,
                             (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              *)&local_138,inlined_at_ctx_00);
  if (!bVar11) goto LAB_0058d362;
  pIVar17 = *(Instruction **)
             ((long)(((calleeFn->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t + 8);
  local_19c = 0;
  if (pIVar17->has_result_id_ == true) {
    local_19c = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
  }
  _Var2.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       ((((local_1a8._M_current)->_M_t).
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->label_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ;
  uVar12 = 0;
  if (*(bool *)((long)_Var2.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
               0x2d) == true) {
    uVar12 = Instruction::GetSingleWordOperand
                       ((Instruction *)
                        _Var2.
                        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
                        (uint)*(bool *)((long)_Var2.
                                              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                              .
                                              super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                              ._M_head_impl + 0x2c));
  }
  pmVar16 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&local_138,&local_19c);
  *pmVar16 = uVar12;
  _Var2.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       ((((local_1a8._M_current)->_M_t).
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->label_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ;
  if (*(bool *)((long)_Var2.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
               0x2d) == true) {
    Instruction::GetSingleWordOperand
              ((Instruction *)
               _Var2.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
               (uint)*(bool *)((long)_Var2.
                                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                     _M_head_impl + 0x2c));
  }
  local_1b0 = &calleeFn->blocks_;
  NewLabel((InlinePass *)local_198,(uint32_t)this);
  pIVar21 = (InlinePass *)0x88;
  local_1b8 = (DebugScope)operator_new(0x88);
  uVar9 = local_198._0_8_;
  uVar12 = 0;
  local_198._0_4_ = 0;
  local_198._4_4_ = 0;
  uVar10 = local_198._0_8_;
  *(undefined8 *)local_1b8 = 0;
  local_198._0_4_ = (undefined4)uVar9;
  local_198._4_4_ = SUB84(uVar9,4);
  ((DebugScope *)((long)local_1b8 + 8))->lexical_scope_ = local_198._0_4_;
  ((DebugScope *)((long)local_1b8 + 8))->inlined_at_ = local_198._4_4_;
  *(Instruction **)((long)local_1b8 + 0x20) = (Instruction *)0x0;
  *(Instruction **)((long)local_1b8 + 0x28) = (Instruction *)0x0;
  (((Instruction *)((long)local_1b8 + 0x18))->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
  _vptr_IntrusiveNodeBase = (_func_int **)&PTR__Instruction_00b15d30;
  *(uint32_t *)((long)local_1b8 + 0x48) = 0;
  *(IRContext **)&(((MessageConsumer *)((long)local_1b8 + 0x38))->super__Function_base)._M_functor =
       (IRContext *)0x0;
  *(undefined8 *)((long)local_1b8 + 0x3e) = 0;
  (((OperandList *)((long)local_1b8 + 0x50))->
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((unique_ptr<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
     *)((long)local_1b8 + 0x58))->_M_t).
  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl =
       (DefUseManager *)0x0;
  (((unique_ptr<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
     *)((long)local_1b8 + 0x60))->_M_t).
  super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl =
       (DecorationManager *)0x0;
  (((vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *)
   ((long)local_1b8 + 0x68))->
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>_>
     *)((long)local_1b8 + 0x70))->_M_h)._M_buckets = (__buckets_ptr)0x0;
  *(pointer *)((long)local_1b8 + 0x78) = (pointer)0x0;
  ((DebugScope *)((long)local_1b8 + 0x80))->lexical_scope_ = 0;
  ((DebugScope *)((long)local_1b8 + 0x80))->inlined_at_ = 0;
  *(Instruction **)((long)local_1b8 + 0x20) = (Instruction *)((long)local_1b8 + 0x18);
  *(Instruction **)((long)local_1b8 + 0x28) = (Instruction *)((long)local_1b8 + 0x18);
  *(bool *)&(((unique_ptr<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_> *)
             ((long)local_1b8 + 0x30))->_M_t).
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl = true;
  (((InstructionList *)((long)local_1b8 + 0x10))->super_IntrusiveList<spvtools::opt::Instruction>).
  _vptr_IntrusiveList = (_func_int **)&PTR__InstructionList_00b15dc8;
  local_f8.node_ = (call_inst_itr->super_iterator).node_;
  call_block_itr_00.iterator_._M_current = local_1a8._M_current;
  call_block_itr_00.container_ = (UptrVector *)inlined_at_ctx_00;
  local_198._0_8_ = uVar10;
  MoveInstsBeforeEntryBlock
            (pIVar21,(unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                      *)(auStack_a8 + 8),(BasicBlock *)local_1b8,(iterator *)&local_f8,
             call_block_itr_00);
  if (local_158 == (Instruction *)0x0) {
LAB_0058cebe:
    this_00._M_head_impl =
         (calleeFn->def_inst_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if ((this_00._M_head_impl)->has_type_id_ == true) {
      uVar12 = Instruction::GetSingleWordOperand(this_00._M_head_impl,0);
    }
    this_02._M_nxt = local_150._M_nxt;
    this_01 = (this->super_Pass).context_;
    if ((this_01->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(this_01);
    }
    pTVar18 = analysis::TypeManager::GetType
                        ((this_01->type_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                         _M_head_impl,uVar12);
    iVar13 = (*pTVar18->_vptr_Type[5])(pTVar18);
    uVar14 = 0;
    if (CONCAT44(extraout_var,iVar13) == 0) {
      uVar14 = CreateReturnVar(this,calleeFn,local_140);
      if (uVar14 == 0) goto LAB_0058d345;
    }
    local_1a8._M_current._0_4_ = uVar14;
    local_198._0_8_ = &local_138;
    p_Stack_180 = std::
                  _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp:639:27)>
                  ::_M_invoke;
    local_188 = std::
                _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp:639:27)>
                ::_M_manager;
    local_198._8_8_ = this;
    opt::Function::WhileEachInst
              (calleeFn,(function<bool_(spvtools::opt::Instruction_*)> *)local_198,false,false);
    if (local_188 != (code *)0x0) {
      (*local_188)(local_198,local_198,3);
    }
    local_188 = (code *)0x0;
    p_Stack_180 = (_Manager_type)0x0;
    local_198._0_8_ = (_func_int **)0x0;
    local_198._8_8_ = (void *)0x0;
    local_198._0_8_ = operator_new(0x20);
    *(DebugScope **)local_198._0_8_ = &local_1b8;
    *(_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      **)(local_198._0_8_ + 8) = &local_138;
    (((InstructionList *)(local_198._0_8_ + 0x10))->super_IntrusiveList<spvtools::opt::Instruction>)
    ._vptr_IntrusiveList = (_func_int **)local_e8;
    (((Instruction *)(local_198._0_8_ + 0x18))->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
    ._vptr_IntrusiveNodeBase = (_func_int **)this;
    p_Stack_180 = std::
                  _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp:652:7)>
                  ::_M_invoke;
    local_188 = std::
                _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp:652:7)>
                ::_M_manager;
    opt::Function::ForEachDebugInstructionsInHeader
              (calleeFn,(function<void_(spvtools::opt::Instruction_*)> *)local_198);
    if (local_188 != (code *)0x0) {
      (*local_188)(local_198,local_198,3);
    }
    callee_first_block.iterator_._M_current =
         (local_1b0->
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    callee_first_block.container_ = local_1b0;
    bVar11 = InlineEntryBlock(this,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    *)&local_138,
                              (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                               *)&local_1b8,callee_first_block,(DebugInlinedAtContext *)local_e8);
    if (!bVar11) goto LAB_0058d345;
    local_168._0_4_ = local_1b8.lexical_scope_;
    local_168._4_4_ = local_1b8.inlined_at_;
    local_1b8.lexical_scope_ = 0;
    local_1b8.inlined_at_ = 0;
    local_1b0 = (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 *)call_inst_itr;
    InlineBasicBlocks((InlinePass *)local_198,
                      (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       *)this,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                               *)this_02._M_nxt,
                      (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       *)&local_138,(DebugInlinedAtContext *)local_168,(Function *)local_e8);
    uVar9 = local_198._0_8_;
    DVar7 = local_1b8;
    local_198._0_8_ = (BasicBlock *)0x0;
    uVar10 = local_198._0_8_;
    local_198._0_4_ = (undefined4)uVar9;
    local_198._4_4_ = SUB84(uVar9,4);
    local_1b8.lexical_scope_ = local_198._0_4_;
    local_1b8.inlined_at_ = local_198._4_4_;
    local_198._0_8_ = uVar10;
    if (DVar7 != (DebugScope)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_1b8,(BasicBlock *)DVar7);
    }
    if ((BasicBlock *)local_198._0_8_ != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)local_198,
                 (BasicBlock *)local_198._0_8_);
    }
    pvVar8 = local_1b0;
    local_198._0_4_ = 0;
    local_198._4_4_ = 0;
    if ((DebugScope)local_168 != (DebugScope)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)local_168,(BasicBlock *)local_168);
    }
    local_168._0_4_ = 0;
    local_168._4_4_ = 0;
    if (local_1b8 == (DebugScope)0x0) goto LAB_0058d345;
    local_170._0_4_ = local_1b8.lexical_scope_;
    local_170._4_4_ = local_1b8.inlined_at_;
    local_1b8.lexical_scope_ = 0;
    local_1b8.inlined_at_ = 0;
    pBVar3 = (calleeFn->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    pIVar17 = (pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar17 == (Instruction *)0x0) ||
       ((pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
      __assert_fail("!insts_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                    ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
    }
    InlineReturn((InlinePass *)local_198,
                 (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)this,(vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                          *)&local_138,
                 (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  *)this_02._M_nxt,(DebugInlinedAtContext *)local_170,(Function *)local_e8,
                 (Instruction *)calleeFn,
                 (uint32_t)
                 (pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
    uVar9 = local_198._0_8_;
    DVar7 = local_1b8;
    local_198._0_8_ = (BasicBlock *)0x0;
    uVar10 = local_198._0_8_;
    local_198._0_4_ = (undefined4)uVar9;
    local_198._4_4_ = SUB84(uVar9,4);
    local_1b8.lexical_scope_ = local_198._0_4_;
    local_1b8.inlined_at_ = local_198._4_4_;
    local_198._0_8_ = uVar10;
    if (DVar7 != (DebugScope)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_1b8,(BasicBlock *)DVar7);
    }
    if ((BasicBlock *)local_198._0_8_ != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)local_198,
                 (BasicBlock *)local_198._0_8_);
    }
    local_198._0_4_ = 0;
    local_198._4_4_ = 0;
    uVar14 = (uint32_t)local_1a8._M_current;
    if ((DebugScope)local_170 != (DebugScope)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)local_170,(BasicBlock *)local_170);
    }
    local_170 = (undefined1  [8])0x0;
    if (uVar14 != 0) {
      pIVar17 = ((iterator *)
                &pvVar8->
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                )->node_;
      resultId = 0;
      if (pIVar17->has_result_id_ == true) {
        resultId = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
      }
      if (resultId == 0) {
        __assert_fail("resId != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp"
                      ,0x2a6,
                      "bool spvtools::opt::InlinePass::GenInlineCode(std::vector<std::unique_ptr<BasicBlock>> *, std::vector<std::unique_ptr<Instruction>> *, BasicBlock::iterator, UptrVectorIterator<BasicBlock>)"
                     );
      }
      pIVar17 = ((iterator *)
                &pvVar8->
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                )->node_;
      pIVar4 = (pIVar17->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      line_inst = (Instruction *)0x0;
      if (pIVar4 != (pIVar17->dbg_line_insts_).
                    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        line_inst = pIVar4;
      }
      AddLoad(this,uVar12,resultId,uVar14,
              (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)&local_1b8,line_inst,&pIVar17->dbg_scope_);
    }
    local_100.super_iterator.node_ =
         (iterator)
         ((iterator *)
         &pvVar8->
          super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         )->node_;
    bVar11 = MoveCallerInstsAfterFunctionCall
                       (this,(unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                              *)(auStack_a8 + 8),
                        (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)local_68,
                        (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         *)&local_1b8,&local_100,
                        (calleeFn->blocks_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        (calleeFn->blocks_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    if (!bVar11) goto LAB_0058d345;
    std::
    vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
              ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                *)this_02._M_nxt,
               (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                *)&local_1b8);
    if ((local_158 != (Instruction *)0x0) &&
       (8 < (ulong)(*(long *)(this_02._M_nxt + 1) - (long)(this_02._M_nxt)->_M_nxt))) {
      MoveLoopMergeInstToFirstBlock
                (this,(vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       *)this_02._M_nxt);
      p_Var22 = (this_02._M_nxt)->_M_nxt;
      pIVar17 = BasicBlock::GetLoopMergeInst((BasicBlock *)p_Var22->_M_nxt);
      uVar20 = (pIVar17->has_result_id_ & 1) + 1;
      if (pIVar17->has_type_id_ == false) {
        uVar20 = (uint)pIVar17->has_result_id_;
      }
      uVar12 = Instruction::GetSingleWordOperand(pIVar17,uVar20 + 1);
      pIVar17 = (Instruction *)p_Var22->_M_nxt[1]._M_nxt;
      uVar14 = 0;
      if (pIVar17->has_result_id_ == true) {
        uVar14 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
      }
      if (uVar12 == uVar14) {
        uVar12 = IRContext::TakeNextId((this->super_Pass).context_);
        if (uVar12 == 0) goto LAB_0058d345;
        UpdateSingleBlockLoopContinueTarget
                  (this,uVar12,
                   (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                    *)this_02._M_nxt);
      }
    }
    p_Var22 = (this_02._M_nxt)->_M_nxt;
    p_Var5 = *(_Hash_node_base **)(this_02._M_nxt + 1);
    if (p_Var22 != p_Var5) {
      do {
        pBVar6 = (mapped_type)p_Var22->_M_nxt;
        pIVar17 = (pBVar6->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar12 = 0;
        if (pIVar17->has_result_id_ == true) {
          uVar12 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
        }
        local_198._0_4_ = uVar12;
        ppBVar19 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->id2block_,(key_type *)local_198);
        *ppBVar19 = pBVar6;
        p_Var22 = p_Var22 + 1;
      } while (p_Var22 != p_Var5);
    }
    IRContext::KillNamesAndDecorates
              ((this->super_Pass).context_,
               ((iterator *)
               &local_1b0->
                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               )->node_);
    local_1b0 = (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
    pIVar17 = BasicBlock::GetMergeInst
                        ((BasicBlock *)
                         (((local_1b0->
                           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t);
    if (pIVar17 == (Instruction *)0x0) goto LAB_0058cebe;
    local_160 = local_1b8;
    local_1b8.lexical_scope_ = 0;
    local_1b8.inlined_at_ = 0;
    AddGuardBlock((InlinePass *)local_198,
                  (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   *)this,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)local_150._M_nxt,
                  (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   *)&local_138,(int)local_168 + 8);
    uVar9 = local_198._0_8_;
    DVar7 = local_1b8;
    local_198._0_8_ = (BasicBlock *)0x0;
    uVar10 = local_198._0_8_;
    local_198._0_4_ = (undefined4)uVar9;
    local_198._4_4_ = SUB84(uVar9,4);
    local_1b8.lexical_scope_ = local_198._0_4_;
    local_1b8.inlined_at_ = local_198._4_4_;
    local_198._0_8_ = uVar10;
    if (DVar7 != (DebugScope)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_1b8,(BasicBlock *)DVar7);
    }
    if ((BasicBlock *)local_198._0_8_ != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)local_198,
                 (BasicBlock *)local_198._0_8_);
    }
    local_198._0_4_ = 0;
    local_198._4_4_ = 0;
    if (local_160 != (DebugScope)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)(local_168 + 8),
                 (BasicBlock *)local_160);
    }
    local_160.lexical_scope_ = 0;
    local_160.inlined_at_ = 0;
    if (local_1b8 != (DebugScope)0x0) goto LAB_0058cebe;
LAB_0058d345:
    local_1b0 = (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 *)0x0;
  }
  if (local_1b8 != (DebugScope)0x0) {
    std::default_delete<spvtools::opt::BasicBlock>::operator()
              ((default_delete<spvtools::opt::BasicBlock> *)&local_1b8,(BasicBlock *)local_1b8);
  }
LAB_0058d362:
  if ((BasicBlock *)local_148._M_nxt != (BasicBlock *)0x0) {
    std::default_delete<spvtools::opt::BasicBlock>::operator()
              ((default_delete<spvtools::opt::BasicBlock> *)&local_148,
               (BasicBlock *)local_148._M_nxt);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_e8 + 0x10));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_68);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(auStack_a8 + 8));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_138);
  return SUB81(local_1b0,0);
}

Assistant:

bool InlinePass::GenInlineCode(
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks,
    std::vector<std::unique_ptr<Instruction>>* new_vars,
    BasicBlock::iterator call_inst_itr,
    UptrVectorIterator<BasicBlock> call_block_itr) {
  // Map from all ids in the callee to their equivalent id in the caller
  // as callee instructions are copied into caller.
  std::unordered_map<uint32_t, uint32_t> callee2caller;
  // Pre-call same-block insts
  std::unordered_map<uint32_t, Instruction*> preCallSB;
  // Post-call same-block op ids
  std::unordered_map<uint32_t, uint32_t> postCallSB;

  analysis::DebugInlinedAtContext inlined_at_ctx(&*call_inst_itr);

  // Invalidate the def-use chains.  They are not kept up to date while
  // inlining.  However, certain calls try to keep them up-to-date if they are
  // valid.  These operations can fail.
  context()->InvalidateAnalyses(IRContext::kAnalysisDefUse);

  // If the caller is a loop header and the callee has multiple blocks, then the
  // normal inlining logic will place the OpLoopMerge in the last of several
  // blocks in the loop.  Instead, it should be placed at the end of the first
  // block.  We'll wait to move the OpLoopMerge until the end of the regular
  // inlining logic, and only if necessary.
  bool caller_is_loop_header = call_block_itr->GetLoopMergeInst() != nullptr;

  // Single-trip loop continue block
  std::unique_ptr<BasicBlock> single_trip_loop_cont_blk;

  Function* calleeFn = id2function_[call_inst_itr->GetSingleWordOperand(
      kSpvFunctionCallFunctionId)];

  // Map parameters to actual arguments.
  MapParams(calleeFn, call_inst_itr, &callee2caller);

  // Define caller local variables for all callee variables and create map to
  // them.
  if (!CloneAndMapLocals(calleeFn, new_vars, &callee2caller, &inlined_at_ctx)) {
    return false;
  }

  // First block needs to use label of original block
  // but map callee label in case of phi reference.
  uint32_t entry_blk_label_id = calleeFn->begin()->GetLabelInst()->result_id();
  callee2caller[entry_blk_label_id] = call_block_itr->id();
  std::unique_ptr<BasicBlock> new_blk_ptr =
      MakeUnique<BasicBlock>(NewLabel(call_block_itr->id()));

  // Move instructions of original caller block up to call instruction.
  MoveInstsBeforeEntryBlock(&preCallSB, new_blk_ptr.get(), call_inst_itr,
                            call_block_itr);

  if (caller_is_loop_header &&
      (*(calleeFn->begin())).GetMergeInst() != nullptr) {
    // We can't place both the caller's merge instruction and
    // another merge instruction in the same block.  So split the
    // calling block. Insert an unconditional branch to a new guard
    // block.  Later, once we know the ID of the last block,  we
    // will move the caller's OpLoopMerge from the last generated
    // block into the first block. We also wait to avoid
    // invalidating various iterators.
    new_blk_ptr = AddGuardBlock(new_blocks, &callee2caller,
                                std::move(new_blk_ptr), entry_blk_label_id);
    if (new_blk_ptr == nullptr) return false;
  }

  // Create return var if needed.
  const uint32_t calleeTypeId = calleeFn->type_id();
  uint32_t returnVarId = 0;
  analysis::Type* calleeType = context()->get_type_mgr()->GetType(calleeTypeId);
  if (calleeType->AsVoid() == nullptr) {
    returnVarId = CreateReturnVar(calleeFn, new_vars);
    if (returnVarId == 0) {
      return false;
    }
  }

  calleeFn->WhileEachInst([&callee2caller, this](const Instruction* cpi) {
    // Create set of callee result ids. Used to detect forward references
    const uint32_t rid = cpi->result_id();
    if (rid != 0 && callee2caller.find(rid) == callee2caller.end()) {
      const uint32_t nid = context()->TakeNextId();
      if (nid == 0) return false;
      callee2caller[rid] = nid;
    }
    return true;
  });

  // Inline DebugClare instructions in the callee's header.
  calleeFn->ForEachDebugInstructionsInHeader(
      [&new_blk_ptr, &callee2caller, &inlined_at_ctx, this](Instruction* inst) {
        InlineSingleInstruction(
            callee2caller, new_blk_ptr.get(), inst,
            context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
                inst->GetDebugScope().GetInlinedAt(), &inlined_at_ctx));
      });

  // Inline the entry block of the callee function.
  if (!InlineEntryBlock(callee2caller, &new_blk_ptr, calleeFn->begin(),
                        &inlined_at_ctx)) {
    return false;
  }

  // Inline blocks of the callee function other than the entry block.
  new_blk_ptr =
      InlineBasicBlocks(new_blocks, callee2caller, std::move(new_blk_ptr),
                        &inlined_at_ctx, calleeFn);
  if (new_blk_ptr == nullptr) return false;

  new_blk_ptr = InlineReturn(callee2caller, new_blocks, std::move(new_blk_ptr),
                             &inlined_at_ctx, calleeFn,
                             &*(calleeFn->tail()->tail()), returnVarId);

  // Load return value into result id of call, if it exists.
  if (returnVarId != 0) {
    const uint32_t resId = call_inst_itr->result_id();
    assert(resId != 0);
    AddLoad(calleeTypeId, resId, returnVarId, &new_blk_ptr,
            call_inst_itr->dbg_line_inst(), call_inst_itr->GetDebugScope());
  }

  // Move instructions of original caller block after call instruction.
  if (!MoveCallerInstsAfterFunctionCall(&preCallSB, &postCallSB, &new_blk_ptr,
                                        call_inst_itr,
                                        calleeFn->begin() != calleeFn->end()))
    return false;

  // Finalize inline code.
  new_blocks->push_back(std::move(new_blk_ptr));

  if (caller_is_loop_header && (new_blocks->size() > 1)) {
    MoveLoopMergeInstToFirstBlock(new_blocks);

    // If the loop was a single basic block previously, update it's structure.
    auto& header = new_blocks->front();
    auto* merge_inst = header->GetLoopMergeInst();
    if (merge_inst->GetSingleWordInOperand(1u) == header->id()) {
      auto new_id = context()->TakeNextId();
      if (new_id == 0) return false;
      UpdateSingleBlockLoopContinueTarget(new_id, new_blocks);
    }
  }

  // Update block map given replacement blocks.
  for (auto& blk : *new_blocks) {
    id2block_[blk->id()] = &*blk;
  }

  // We need to kill the name and decorations for the call, which will be
  // deleted.
  context()->KillNamesAndDecorates(&*call_inst_itr);

  return true;
}